

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait_test.c
# Opt level: O3

void test_mu_producer_consumer2(testing t)

{
  mu_queue *q;
  closure *cl;
  int count;
  int start;
  
  q = (mu_queue *)calloc(1,0x340);
  q->limit = 100;
  cl = (closure *)malloc(0x28);
  cl->f0 = closure_f0_producer_mu_n;
  cl[1].f0 = producer_mu_n;
  cl[2].f0 = (_func_void_void_ptr *)t;
  cl[3].f0 = (_func_void_void_ptr *)q;
  count = 0;
  cl[4].f0 = (_func_void_void_ptr *)0x186a000000000;
  closure_fork(cl);
  consumer_mu_n(t,q,start,count);
  free(q);
  return;
}

Assistant:

static void test_mu_producer_consumer2 (testing t) {
	mu_queue *q = mu_queue_new (100);
	closure_fork (closure_producer_mu_n (&producer_mu_n, t, q, 0, MU_PRODUCER_CONSUMER_N));
	consumer_mu_n (t, q, 0, MU_PRODUCER_CONSUMER_N);
	free (q);
}